

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O0

void __thiscall
Transporter::Send(Transporter *this,uv_stream_t *handler,int cmd,char *data,size_t len)

{
  bool bVar1;
  int iVar2;
  void *__s;
  size_t __size;
  char *base;
  uv_async_t *handle;
  uv_buf_t uVar3;
  uv_async_t *async;
  size_t local_c8;
  char *newData;
  size_t newLen;
  char local_a8 [4];
  int l1;
  char cmdValue [100];
  write_req_t *writeReq;
  size_t len_local;
  char *data_local;
  int cmd_local;
  uv_stream_t *handler_local;
  Transporter *this_local;
  
  bVar1 = IsConnected(this);
  if (bVar1) {
    __s = operator_new(0xd8);
    memset(__s,0,0xd8);
    iVar2 = sprintf(local_a8,"%d\n",(ulong)(uint)cmd);
    __size = len + (long)iVar2 + 1;
    base = (char *)malloc(__size);
    memcpy(base,local_a8,(long)iVar2);
    memcpy(base + iVar2,data,len);
    base[len + (long)iVar2] = '\n';
    uVar3 = uv_buf_init(base,(uint)__size);
    async = (uv_async_t *)uVar3.base;
    *(uv_async_t **)((long)__s + 0xc0) = async;
    local_c8 = uVar3.len;
    *(size_t *)((long)__s + 200) = local_c8;
    *(uv_stream_t **)((long)__s + 0xd0) = handler;
    handle = (uv_async_t *)operator_new(0x80);
    handle->data = __s;
    uv_async_init(this->loop,handle,async_write);
    uv_async_send(handle);
  }
  return;
}

Assistant:

void Transporter::Send(uv_stream_t* handler, int cmd, const char* data, size_t len)
{
	if (!IsConnected())
	{
		return;
	}
	auto* writeReq = new write_req_t();
	char cmdValue[100];
	const int l1 = sprintf(cmdValue, "%d\n", cmd);
	const size_t newLen = len + l1 + 1;
	char* newData = static_cast<char*>(malloc(newLen));
	// line1
	memcpy(newData, cmdValue, l1);
	// line2
	memcpy(newData + l1, data, len);
	newData[newLen - 1] = '\n';
	writeReq->buf = uv_buf_init(newData, newLen);
	writeReq->handler = handler;

	// thread safe:
	auto* async = new uv_async_t;
	async->data = writeReq;
	uv_async_init(loop, async, async_write);
	uv_async_send(async);
}